

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O3

int __thiscall BlurayHelper::open(BlurayHelper *this,char *__file,int __oflag,...)

{
  string *src;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char delimiter;
  int iVar2;
  IsoWriter *this_00;
  int in_ECX;
  uint in_R8D;
  char in_R9B;
  string fileExt;
  string local_c0;
  IsoHeaderData local_a0;
  string local_50;
  
  toNativeSeparators(&local_a0.appId,(string *)__file);
  src = &this->m_dstPath;
  std::__cxx11::string::operator=((string *)src,(string *)&local_a0);
  paVar1 = &local_a0.appId.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.appId._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.appId._M_dataplus._M_p,local_a0.appId.field_2._M_allocated_capacity + 1
                   );
  }
  this->m_dt = __oflag;
  extractFileExt(&local_c0,src);
  strToUpperCase(&local_50,&local_c0);
  unquoteStr(&local_a0.appId,&local_50);
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.appId._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.appId._M_dataplus._M_p,local_a0.appId.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_c0);
  if (iVar2 == 0) {
    this_00 = (IsoWriter *)operator_new(0x930);
    if (in_R9B == '\0') {
      IsoHeaderData::normal();
    }
    else {
      IsoHeaderData::reproducible();
    }
    IsoWriter::IsoWriter(this_00,&local_a0);
    this->m_isoWriter = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.impId._M_dataplus._M_p != &local_a0.impId.field_2) {
      operator_delete(local_a0.impId._M_dataplus._M_p,
                      local_a0.impId.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.appId._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.appId._M_dataplus._M_p,
                      local_a0.appId.field_2._M_allocated_capacity + 1);
    }
    IsoWriter::setLayerBreakPoint(this->m_isoWriter,0xba7200);
    iVar2 = IsoWriter::open(this->m_isoWriter,(char *)src,in_ECX,(ulong)in_R8D);
  }
  else {
    delimiter = getDirSeparator();
    closeDirPath(&local_a0.appId,src,delimiter);
    std::__cxx11::string::operator=((string *)src,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.appId._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.appId._M_dataplus._M_p,
                      local_a0.appId.field_2._M_allocated_capacity + 1);
    }
    iVar2 = (int)CONCAT71((int7)((ulong)src >> 8),1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

bool BlurayHelper::open(const string& dst, const DiskType dt, const int64_t diskSize, const int extraISOBlocks,
                        const bool useReproducibleIsoHeader)
{
    m_dstPath = toNativeSeparators(dst);

    m_dt = dt;
    string fileExt = extractFileExt(m_dstPath);
    fileExt = unquoteStr(strToUpperCase(fileExt));
    if (fileExt == "ISO")
    {
        m_isoWriter = new IsoWriter(useReproducibleIsoHeader ? IsoHeaderData::reproducible() : IsoHeaderData::normal());
        m_isoWriter->setLayerBreakPoint(0xBA7200);  // around 25Gb
        return m_isoWriter->open(m_dstPath, diskSize, extraISOBlocks);
    }
    m_dstPath = closeDirPath(m_dstPath, getDirSeparator());
    return true;
}